

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void abort_write_jobs(cio_websocket *websocket)

{
  cio_websocket_write_job *local_18;
  cio_websocket_write_job *job;
  cio_websocket *websocket_local;
  
  local_18 = dequeue_job(websocket);
  while (local_18 != (cio_websocket_write_job *)0x0) {
    local_18->wbh = (cio_write_buffer *)0x0;
    if (local_18->handler != (cio_websocket_write_handler_t)0x0) {
      (*local_18->handler)(websocket,local_18->handler_context,CIO_OPERATION_ABORTED);
    }
    local_18 = dequeue_job(websocket);
  }
  return;
}

Assistant:

static void abort_write_jobs(struct cio_websocket *websocket)
{
	struct cio_websocket_write_job *job = dequeue_job(websocket);

	while (job != NULL) {
		job->wbh = NULL;
		if (job->handler) {
			job->handler(websocket, job->handler_context, CIO_OPERATION_ABORTED);
		}

		job = dequeue_job(websocket);
	}
}